

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O2

void __thiscall
SimpleBVH::BVH::facet_in_envelope_recursive
          (BVH *this,VectorMax3d *p,double sq_epsilon,int *nearest_f,VectorMax3d *nearest_point,
          double *sq_dist,int n,int b,int e)

{
  pointer paVar1;
  int n_00;
  int b_00;
  ulong uVar2;
  int n_01;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 local_88 [8];
  VectorMax3d cur_nearest_point;
  double cur_sq_dist;
  
  if (e - b == 0 || e < b) {
    __assert_fail("e > b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                  ,0x1e2,
                  "void SimpleBVH::BVH::facet_in_envelope_recursive(const VectorMax3d &, double, int &, VectorMax3d &, double &, int, int, int) const"
                 );
  }
  if (sq_epsilon < *sq_dist) {
    if (b + 1 == e) {
      cur_nearest_point.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
      m_data.array[2] = 0.0;
      leaf_callback(this,p,(this->new2old).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[b],(VectorMax3d *)local_88,
                    (double *)
                    &cur_nearest_point.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                     .m_storage.m_rows);
      if ((double)cur_nearest_point.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                  m_storage.m_rows < *sq_dist) {
        *nearest_f = b;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,3,1>,Eigen::Matrix<double,_1,1,0,3,1>>
                  (nearest_point,(Matrix<double,__1,_1,_0,_3,_1> *)local_88);
        *sq_dist = (double)cur_nearest_point.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                           m_rows;
      }
    }
    else {
      n_00 = n * 2;
      paVar1 = (this->boxlist).
               super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = (long)(this->boxlist).
                    super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1 >> 6;
      if (uVar2 <= (ulong)(long)n_00) {
        __assert_fail("childl < boxlist.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                      ,0x1f9,
                      "void SimpleBVH::BVH::facet_in_envelope_recursive(const VectorMax3d &, double, int &, VectorMax3d &, double &, int, int, int) const"
                     );
      }
      n_01 = n * 2 + 1;
      if (uVar2 <= (ulong)(long)n_01) {
        __assert_fail("childr < boxlist.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                      ,0x1fa,
                      "void SimpleBVH::BVH::facet_in_envelope_recursive(const VectorMax3d &, double, int &, VectorMax3d &, double &, int, int, int) const"
                     );
      }
      b_00 = (e - b) / 2 + b;
      dVar3 = anon_unknown_6::point_box_signed_squared_distance(p,paVar1 + n_00);
      dVar4 = anon_unknown_6::point_box_signed_squared_distance
                        (p,(this->boxlist).
                           super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + n_01);
      dVar5 = *sq_dist;
      if (dVar4 <= dVar3) {
        if ((dVar4 <= sq_epsilon) && (dVar4 < dVar5)) {
          facet_in_envelope_recursive(this,p,sq_epsilon,nearest_f,nearest_point,sq_dist,n_01,b_00,e)
          ;
          dVar5 = *sq_dist;
        }
        if (sq_epsilon < dVar3) {
          return;
        }
        n_01 = n_00;
        e = b_00;
        if (dVar5 <= dVar3) {
          return;
        }
      }
      else {
        if ((dVar3 <= sq_epsilon) && (dVar3 < dVar5)) {
          facet_in_envelope_recursive(this,p,sq_epsilon,nearest_f,nearest_point,sq_dist,n_00,b,b_00)
          ;
          dVar5 = *sq_dist;
        }
        if (sq_epsilon < dVar4) {
          return;
        }
        b = b_00;
        if (dVar5 <= dVar4) {
          return;
        }
      }
      facet_in_envelope_recursive(this,p,sq_epsilon,nearest_f,nearest_point,sq_dist,n_01,b,e);
    }
  }
  return;
}

Assistant:

void BVH::facet_in_envelope_recursive(
    const VectorMax3d& p,
    double sq_epsilon,
    int& nearest_f,
    VectorMax3d& nearest_point,
    double& sq_dist,
    int n,
    int b,
    int e) const
{
    assert(e > b);

    if (sq_dist <= sq_epsilon) {
        return;
    }

    // If node is a leaf: compute point-facet distance
    // and replace current if nearer
    if (b + 1 == e) {
        VectorMax3d cur_nearest_point;
        double cur_sq_dist;
        leaf_callback(p, new2old[b], cur_nearest_point, cur_sq_dist);
        if (cur_sq_dist < sq_dist) {
            nearest_f = b;
            nearest_point = cur_nearest_point;
            sq_dist = cur_sq_dist;
        }
        return;
    }
    int m = b + (e - b) / 2;
    int childl = 2 * n;
    int childr = 2 * n + 1;

    assert(childl < boxlist.size());
    assert(childr < boxlist.size());

    double dl = point_box_signed_squared_distance(p, boxlist[childl]);
    double dr = point_box_signed_squared_distance(p, boxlist[childr]);

    // Traverse the "nearest" child first, so that it has more chances
    // to prune the traversal of the other child.
    if (dl < dr) {
        if (dl < sq_dist && dl <= sq_epsilon) {
            facet_in_envelope_recursive(
                p, sq_epsilon, nearest_f, nearest_point, sq_dist, childl, b, m);
        }
        if (dr < sq_dist && dr <= sq_epsilon) {
            facet_in_envelope_recursive(
                p, sq_epsilon, nearest_f, nearest_point, sq_dist, childr, m, e);
        }
    } else {
        if (dr < sq_dist && dr <= sq_epsilon) {
            facet_in_envelope_recursive(
                p, sq_epsilon, nearest_f, nearest_point, sq_dist, childr, m, e);
        }
        if (dl < sq_dist && dl <= sq_epsilon) {
            facet_in_envelope_recursive(
                p, sq_epsilon, nearest_f, nearest_point, sq_dist, childl, b, m);
        }
    }
}